

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
::freeAll(StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
          *this)

{
  long lVar1;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar2;
  Filter *pFVar3;
  int jj;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  if (this->dataptr != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
    if (0 < (long)this->bsize) {
      uVar6 = (long)this->bsize + 1;
      do {
        puVar2 = this->dataptr[this->dataSlotIndex];
        pFVar3 = puVar2[uVar6 - 2]._M_t.
                 super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                 super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
        if (pFVar3 != (Filter *)0x0) {
          (**(code **)((long)(pFVar3->super_Interface)._vptr_Interface + 8))();
        }
        puVar2[uVar6 - 2]._M_t.
        super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
        super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
        super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
    iVar5 = this->dataSlotIndex;
    if (0 < (long)iVar5) {
      operator_delete(this->dataptr[iVar5],0x100);
      iVar5 = this->dataSlotIndex;
      lVar7 = (long)iVar5;
      if (0 < (long)iVar5) {
        do {
          lVar1 = lVar7 + -1;
          lVar4 = 0x1f;
          do {
            puVar2 = this->dataptr[lVar1];
            pFVar3 = puVar2[lVar4]._M_t.
                     super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                     super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
            if (pFVar3 != (Filter *)0x0) {
              (**(code **)((long)(pFVar3->super_Interface)._vptr_Interface + 8))();
            }
            puVar2[lVar4]._M_t.
            super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
            super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
            super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
            bVar8 = lVar4 != 0;
            lVar4 = lVar4 + -1;
          } while (bVar8);
          operator_delete(this->dataptr[lVar1],0x100);
          bVar8 = 1 < lVar7;
          lVar7 = lVar1;
        } while (bVar8);
        iVar5 = this->dataSlotIndex;
      }
    }
    if (iVar5 == 0) {
      operator_delete(*this->dataptr,0x100);
    }
    if (0 < this->freeIndex) {
      lVar7 = 0;
      do {
        operator_delete(this->freeblocks[lVar7],0x100);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->freeIndex);
    }
    if (this->freeblocks != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0
       ) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }